

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

void __thiscall chaiscript::detail::Dispatch_Engine::new_scope(Dispatch_Engine *this)

{
  Stack_Holder *t_holder;
  
  t_holder = threading::Thread_Storage<chaiscript::detail::Stack_Holder>::operator*
                       (&this->m_stack_holder);
  new_scope(t_holder);
  return;
}

Assistant:

void new_scope() { new_scope(*m_stack_holder); }